

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O1

bool anon_unknown.dwarf_1c85cc7::hasSameDims(Type *left,Type *right)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ConstantRange CVar4;
  ConstantRange CVar5;
  int iVar6;
  int iVar7;
  
  do {
    CVar4 = slang::ast::Type::getFixedRange(left);
    CVar5 = slang::ast::Type::getFixedRange(right);
    iVar3 = CVar5.left;
    iVar6 = CVar5.right;
    iVar1 = iVar3 - iVar6;
    if (iVar3 - iVar6 == 0 || iVar3 < iVar6) {
      iVar1 = -(iVar3 - iVar6);
    }
    iVar7 = CVar4.left;
    iVar6 = CVar4.right;
    iVar3 = iVar7 - iVar6;
    if (iVar7 - iVar6 == 0 || iVar7 < iVar6) {
      iVar3 = -(iVar7 - iVar6);
    }
    if (iVar3 != iVar1) {
      return false;
    }
    left = slang::ast::Type::getArrayElementType(left);
    right = slang::ast::Type::getArrayElementType(right);
    bVar2 = (right != (Type *)0x0) == (left != (Type *)0x0);
    if (left == (Type *)0x0) {
      return bVar2;
    }
  } while (right != (Type *)0x0);
  return bVar2;
}

Assistant:

bool hasSameDims(const Type& left, const Type& right) {
    if (left.getFixedRange().width() != right.getFixedRange().width())
        return false;

    auto le = left.getArrayElementType();
    auto re = right.getArrayElementType();
    if (bool(le) != bool(re))
        return false;

    if (!le)
        return true;

    return hasSameDims(*le, *re);
}